

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>
          (DelayedEofInputStream *this,unsigned_long requested,Promise<unsigned_long> *innerPromise)

{
  SourceLocation location;
  Type *in_RCX;
  SourceLocation local_58;
  unsigned_long local_40;
  Type local_38;
  Promise<unsigned_long> *local_30;
  Promise<unsigned_long> *innerPromise_local;
  unsigned_long requested_local;
  DelayedEofInputStream *this_local;
  
  local_40 = requested;
  local_38.this = (DelayedEofInputStream *)requested;
  local_30 = innerPromise;
  innerPromise_local = innerPromise;
  requested_local = requested;
  this_local = this;
  SourceLocation::SourceLocation
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,&DAT_00a71040,0x1ab7,0xe);
  location.function = local_58.function;
  location.fileName = local_58.fileName;
  location.lineNumber = local_58.lineNumber;
  location.columnNumber = local_58.columnNumber;
  Promise<unsigned_long>::
  then<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>(unsigned_long,kj::Promise<unsigned_long>)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::wrap<unsigned_long>(unsigned_long,kj::Promise<unsigned_long>)::_lambda(kj::Exception&&)_1_>
            ((Promise<unsigned_long> *)this,in_RCX,&local_38,location);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<T> wrap(T requested, kj::Promise<T> innerPromise) {
      return innerPromise.then([this,requested](T actual) -> kj::Promise<T> {
        if (actual < requested) {
          // Must have reached EOF.
          KJ_IF_SOME(t, completionTask) {
            // Delay until completion.
            auto result = t.then([actual]() { return actual; });
            completionTask = kj::none;
            return result;
          } else {
            // Must have called tryRead() again after we already signaled EOF. Fine.
            return actual;
          }
        } else {
          return actual;
        }
      }, [this](kj::Exception&& e) -> kj::Promise<T> {
        // The stream threw an exception, but this exception is almost certainly just complaining
        // that the other end of the stream was dropped. In all likelihood, the HttpService
        // request() call itself will throw a much more interesting error -- we'd rather propagate
        // that one, if so.
        KJ_IF_SOME(t, completionTask) {
          auto result = t.then([e = kj::mv(e)]() mutable -> kj::Promise<T> {
            // Looks like the service didn't throw. I guess we should propagate the stream error
            // after all.
            return kj::mv(e);
          });
          completionTask = kj::none;
          return result;
        } else {
          // Must have called tryRead() again after we already signaled EOF or threw. Fine.
          return kj::mv(e);
        }
      });
    }